

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  vec<3,_float,_(glm::qualifier)0> vVar1;
  vec<3,_float,_(glm::qualifier)0> local_20;
  vec<3,_float,_(glm::qualifier)0> local_10;
  
  if (action != 1) {
    return;
  }
  cameraSpeed = deltaTime * 500.0;
  switch(key) {
  case 0x31:
    curMotion = ONE;
    break;
  case 0x32:
    curMotion = TWO;
    break;
  case 0x33:
    curMotion = THREE;
    break;
  case 0x34:
    curMotion = FOUR;
    break;
  case 0x35:
    curMotion = FIVE;
    break;
  case 0x36:
    curMotion = SIX;
    break;
  case 0x37:
    curMotion = SEVEN;
    break;
  case 0x38:
    bingoFlag = 0;
    cur_passed_time = passed_time;
    curMotion = EIGHT;
    break;
  case 0x39:
    curMotion = NINE;
    break;
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x43:
  case 0x45:
  case 0x46:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x54:
    break;
  case 0x41:
    local_10 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call
                         (&cameraFront,&cameraUp);
    vVar1 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_10);
    local_20.field_1.y = cameraSpeed * vVar1.field_1.y;
    local_20.field_0.x = cameraSpeed * vVar1.field_0.x;
    local_20.field_2.z = vVar1.field_2.z * cameraSpeed;
    goto LAB_00124dec;
  case 0x42:
    bingoFlag = 0;
    cur_passed_time = passed_time;
    curMotion = BINGO;
    break;
  case 0x44:
    local_10 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call
                         (&cameraFront,&cameraUp);
    vVar1 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_10);
    local_20.field_1.y = cameraSpeed * vVar1.field_1.y;
    local_20.field_0.x = cameraSpeed * vVar1.field_0.x;
    local_20.field_2.z = vVar1.field_2.z * cameraSpeed;
    goto LAB_00124d40;
  case 0x47:
    curMotion = GRASP;
    break;
  case 0x4f:
    curMotion = OK;
    break;
  case 0x53:
    local_20 = glm::operator*(cameraSpeed,&cameraUp);
LAB_00124dec:
    glm::vec<3,float,(glm::qualifier)0>::operator+=
              ((vec<3,float,(glm::qualifier)0> *)&cameraPos,&local_20);
    break;
  case 0x55:
    bingoFlag = 0;
    cur_passed_time = passed_time;
    curMotion = GUN;
    break;
  case 0x56:
    curMotion = WAVE;
    break;
  case 0x57:
    local_20 = glm::operator*(cameraSpeed,&cameraUp);
LAB_00124d40:
    glm::vec<3,float,(glm::qualifier)0>::operator-=
              ((vec<3,float,(glm::qualifier)0> *)&cameraPos,&local_20);
    break;
  default:
    if (key == 0x20) {
      if (curMotion == PAUSE) {
        curMotion = motionBeforePause;
      }
      else {
        motionBeforePause = curMotion;
        curMotion = PAUSE;
      }
    }
    else if (key == 0x100) {
      glfwSetWindowShouldClose(window,1);
      return;
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow *window, int key, int scancode, int action, int mods) {
    if(action == GLFW_PRESS){
        cameraSpeed = 500.0f*deltaTime;
        switch(key){
            case GLFW_KEY_ESCAPE:
                glfwSetWindowShouldClose(window, GLFW_TRUE);
                break;
            case GLFW_KEY_W://图像向上
                cameraPos -= cameraSpeed * cameraUp;
                break;
            case GLFW_KEY_S://图像向下
                cameraPos += cameraSpeed * cameraUp;
                break;
            case GLFW_KEY_A://图像向左
                cameraPos += glm::normalize(glm::cross(cameraFront, cameraUp)) * cameraSpeed;
                break;
            case GLFW_KEY_D://图像向右
                cameraPos -= glm::normalize(glm::cross(cameraFront, cameraUp)) * cameraSpeed;
                break;
            case GLFW_KEY_G://GRASP
                curMotion = GRASP;
                break;
            case GLFW_KEY_V://WAVE
                curMotion = WAVE;
                break;
            case GLFW_KEY_O://OK
                curMotion = OK;
                break;
            case GLFW_KEY_B://BINGO
                bingoFlag = 0;
                cur_passed_time = passed_time;
                curMotion = BINGO;
                break;
            case GLFW_KEY_U://GUN
                bingoFlag = 0;
                cur_passed_time = passed_time;
                curMotion = GUN;
                break;
            case GLFW_KEY_1:
                curMotion = ONE;
                break;
            case GLFW_KEY_2:
                curMotion = TWO;
                break;
            case GLFW_KEY_3:
                curMotion = THREE;
                break;
            case GLFW_KEY_4:
                curMotion = FOUR;
                break;
            case GLFW_KEY_5:
                curMotion = FIVE;
                break;
            case GLFW_KEY_6:
                curMotion = SIX;
                break;
            case GLFW_KEY_7:
                curMotion = SEVEN;
                break;
            case GLFW_KEY_8:
                bingoFlag = 0;
                cur_passed_time = passed_time;
                curMotion = EIGHT;
                break;
            case GLFW_KEY_9:
                curMotion = NINE;
                break;
            case GLFW_KEY_SPACE:
                if(curMotion != PAUSE) {
                    motionBeforePause = curMotion;
                    curMotion = PAUSE;
                } else{
                    curMotion = motionBeforePause;
                }
            default:
                break;
        }
    }
}